

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActiveDirectory.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::ActiveDirectory::readRoles_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ActiveDirectory *this)

{
  Client *client;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Url local_38;
  ActiveDirectory *local_18;
  ActiveDirectory *this_local;
  
  client = *(Client **)this;
  local_18 = this;
  this_local = (ActiveDirectory *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"roles",&local_79);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_58,&local_78);
  getUrl(&local_38,this,&local_58);
  HttpConsumer::list(__return_storage_ptr__,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::ActiveDirectory::readRoles() {
  return HttpConsumer::list(client_, getUrl(Path{"roles"}));
}